

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyhash.c
# Opt level: O2

tommy_uint64_t tommy_hash_u64(tommy_uint64_t init_val,void *void_key,tommy_size_t key_len)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  long in_FS_OFFSET;
  
  uVar4 = (int)init_val + (int)key_len + 0xdeadbeef;
  uVar1 = (int)(init_val >> 0x20) + (int)init_val + (int)key_len + 0xdeadbeef;
  uVar5 = uVar4;
LAB_0010342c:
  switch(key_len) {
  case 0:
switchD_001034ab_caseD_0:
    if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
      __stack_chk_fail();
    }
    return CONCAT44(uVar5,uVar1);
  case 1:
    goto switchD_001034ab_caseD_1;
  case 2:
    goto switchD_001034ab_caseD_2;
  case 3:
    uVar4 = uVar4 + (uint)*(byte *)((long)void_key + 2) * 0x10000;
    goto switchD_001034ab_caseD_2;
  case 4:
    goto switchD_001034ab_caseD_4;
  case 5:
    goto switchD_001034ab_caseD_5;
  case 6:
    goto switchD_001034ab_caseD_6;
  case 7:
    uVar5 = uVar5 + (uint)*(byte *)((long)void_key + 6) * 0x10000;
    goto switchD_001034ab_caseD_6;
  case 8:
    break;
  case 9:
    goto switchD_001034ab_caseD_9;
  case 10:
    goto switchD_001034ab_caseD_a;
  case 0xb:
    uVar1 = uVar1 + (uint)*(byte *)((long)void_key + 10) * 0x10000;
    goto switchD_001034ab_caseD_a;
  case 0xc:
    uVar1 = uVar1 + *(int *)((long)void_key + 8);
    break;
  default:
    goto switchD_001034ab_default;
  }
switchD_001034ab_caseD_8:
  uVar5 = uVar5 + *(int *)((long)void_key + 4);
switchD_001034ab_caseD_4:
  uVar4 = uVar4 + *void_key;
LAB_00103506:
  uVar1 = (uVar1 ^ uVar5) - (uVar5 << 0xe | uVar5 >> 0x12);
  uVar4 = (uVar4 ^ uVar1) - (uVar1 * 0x800 | uVar1 >> 0x15);
  uVar5 = (uVar5 ^ uVar4) - (uVar4 * 0x2000000 | uVar4 >> 7);
  uVar1 = (uVar1 ^ uVar5) - (uVar5 * 0x10000 | uVar5 >> 0x10);
  uVar4 = (uVar4 ^ uVar1) - (uVar1 * 0x10 | uVar1 >> 0x1c);
  uVar5 = (uVar5 ^ uVar4) - (uVar4 * 0x4000 | uVar4 >> 0x12);
  uVar1 = (uVar1 ^ uVar5) - (uVar5 * 0x1000000 | uVar5 >> 8);
  goto switchD_001034ab_caseD_0;
switchD_001034ab_default:
  uVar1 = uVar1 + *(int *)((long)void_key + 8);
  uVar4 = (uVar1 * 0x10 | uVar1 >> 0x1c) ^ (uVar4 + *void_key) - uVar1;
  iVar2 = uVar1 + uVar5 + *(int *)((long)void_key + 4);
  uVar5 = (uVar4 << 6 | uVar4 >> 0x1a) ^ (uVar5 + *(int *)((long)void_key + 4)) - uVar4;
  iVar3 = uVar4 + iVar2;
  uVar1 = (uVar5 << 8 | uVar5 >> 0x18) ^ iVar2 - uVar5;
  iVar2 = uVar5 + iVar3;
  uVar4 = (uVar1 << 0x10 | uVar1 >> 0x10) ^ iVar3 - uVar1;
  iVar3 = uVar1 + iVar2;
  uVar5 = (uVar4 << 0x13 | uVar4 >> 0xd) ^ iVar2 - uVar4;
  uVar4 = uVar4 + iVar3;
  uVar1 = (uVar5 << 4 | uVar5 >> 0x1c) ^ iVar3 - uVar5;
  uVar5 = uVar5 + uVar4;
  key_len = key_len - 0xc;
  void_key = (void *)((long)void_key + 0xc);
  goto LAB_0010342c;
switchD_001034ab_caseD_a:
  uVar1 = uVar1 + (uint)*(byte *)((long)void_key + 9) * 0x100;
switchD_001034ab_caseD_9:
  uVar1 = uVar1 + *(byte *)((long)void_key + 8);
  goto switchD_001034ab_caseD_8;
switchD_001034ab_caseD_6:
  uVar5 = uVar5 + (uint)*(byte *)((long)void_key + 5) * 0x100;
switchD_001034ab_caseD_5:
  uVar5 = uVar5 + *(byte *)((long)void_key + 4);
  goto switchD_001034ab_caseD_4;
switchD_001034ab_caseD_2:
  uVar4 = uVar4 + (uint)*(byte *)((long)void_key + 1) * 0x100;
switchD_001034ab_caseD_1:
  uVar4 = uVar4 + *void_key;
  goto LAB_00103506;
}

Assistant:

tommy_uint64_t tommy_hash_u64(tommy_uint64_t init_val, const void* void_key, tommy_size_t key_len)
{
	const unsigned char* key = tommy_cast(const unsigned char*, void_key);
	tommy_uint32_t a, b, c;

	a = b = c = 0xdeadbeef + ((tommy_uint32_t)key_len) + (init_val & 0xffffffff);
	c += init_val >> 32;

	while (key_len > 12) {
		a += tommy_le_uint32_read(key + 0);
		b += tommy_le_uint32_read(key + 4);
		c += tommy_le_uint32_read(key + 8);

		tommy_mix(a, b, c);

		key_len -= 12;
		key += 12;
	}

	switch (key_len) {
	case 0 :
		return c + ((tommy_uint64_t)b << 32); /* used only when called with a zero length */
	case 12 :
		c += tommy_le_uint32_read(key + 8);
		b += tommy_le_uint32_read(key + 4);
		a += tommy_le_uint32_read(key + 0);
		break;
	case 11 : c += ((tommy_uint32_t)key[10]) << 16; /* fallthrough */
	case 10 : c += ((tommy_uint32_t)key[9]) << 8; /* fallthrough */
	case 9 : c += key[8]; /* fallthrough */
	case 8 :
		b += tommy_le_uint32_read(key + 4);
		a += tommy_le_uint32_read(key + 0);
		break;
	case 7 : b += ((tommy_uint32_t)key[6]) << 16; /* fallthrough */
	case 6 : b += ((tommy_uint32_t)key[5]) << 8; /* fallthrough */
	case 5 : b += key[4]; /* fallthrough */
	case 4 :
		a += tommy_le_uint32_read(key + 0);
		break;
	case 3 : a += ((tommy_uint32_t)key[2]) << 16; /* fallthrough */
	case 2 : a += ((tommy_uint32_t)key[1]) << 8; /* fallthrough */
	case 1 : a += key[0]; /* fallthrough */
	}

	tommy_final(a, b, c);

	return c + ((tommy_uint64_t)b << 32);
}